

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

Abc_Des_t * Ver_ParseFile(char *pFileName,Abc_Des_t *pGateLib,int fCheck,int fUseMemMan)

{
  char *pcVar1;
  FILE *pFile;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Ver_Man_t *pMan;
  Ver_Stream_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  Abc_Des_t *pAVar9;
  void *pvVar10;
  ProgressBar *pPVar11;
  char *__s1;
  Ver_Bundle_t *pBundle0;
  Abc_Ntk_t *pAVar12;
  int Counter;
  
  pMan = (Ver_Man_t *)calloc(1,0x840);
  pMan->pFileName = pFileName;
  pVVar6 = Ver_StreamAlloc(pFileName);
  pMan->pReader = pVVar6;
  if (pVVar6 == (Ver_Stream_t *)0x0) {
    free(pMan);
    pMan = (Ver_Man_t *)0x0;
  }
  else {
    pMan->Output = _stdout;
    iVar2 = 100;
    pVVar7 = Vec_PtrAlloc(100);
    pMan->vNames = pVVar7;
    pVVar7 = Vec_PtrAlloc(100);
    pMan->vStackFn = pVVar7;
    pVVar8 = Vec_IntAlloc(iVar2);
    pMan->vStackOp = pVVar8;
    pVVar8 = Vec_IntAlloc(iVar2);
    pMan->vPerm = pVVar8;
    pAVar9 = Abc_DesCreate(pFileName);
    pMan->pDesign = pAVar9;
    pAVar9->pLibrary = pGateLib;
    pvVar10 = Abc_FrameReadLibGen();
    pAVar9->pGenlib = pvVar10;
  }
  iVar2 = glo_fMapped;
  pMan->fMapped = glo_fMapped;
  pMan->fCheck = fCheck;
  pMan->fUseMemMan = fUseMemMan;
  if (iVar2 != 0) {
    Hop_ManStop((Hop_Man_t *)pMan->pDesign->pManFunc);
    pMan->pDesign->pManFunc = (void *)0x0;
  }
  pFile = _stdout;
  iVar2 = Ver_StreamGetFileSize(pMan->pReader);
  pPVar11 = Extra_ProgressBarStart(pFile,iVar2);
  pMan->pProgress = pPVar11;
  do {
    __s1 = Ver_ParseGetName(pMan);
    if (__s1 == (char *)0x0) {
      Extra_ProgressBarStop(pMan->pProgress);
      pMan->pProgress = (ProgressBar *)0x0;
      uVar3 = Ver_ParseConnectDefBoxes(pMan);
      if (1 < uVar3) {
        Ver_ParseReportUndefBoxes(pMan);
        pVVar7 = Ver_ParseCollectUndefBoxes(pMan);
        iVar2 = pVVar7->nSize;
        if (iVar2 < 1) {
          __assert_fail("Vec_PtrSize( vUndefs ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                        ,0xb4c,"int Ver_ParseAttachBoxes(Ver_Man_t *)");
        }
        iVar5 = Ver_ParseMaxBoxSize(pVVar7);
        Counter = 0;
        goto LAB_002ada9e;
      }
      if (uVar3 != 0) goto LAB_002adb45;
      break;
    }
    iVar2 = strcmp(__s1,"module");
    if (iVar2 != 0) {
      builtin_strncpy(pcVar1,"Cannot read \"module\" directive.",0x20);
      pcVar1 = pMan->sError;
      goto LAB_002ad9f7;
    }
    iVar2 = Ver_ParseModule(pMan);
  } while (iVar2 != 0);
  goto LAB_002ad9ff;
  while( true ) {
    iVar4 = 0;
    do {
      if (iVar2 == iVar4) {
        Counter = Counter + 1;
        goto LAB_002ada9e;
      }
      pAVar12 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar7,iVar4);
      pBundle0 = Ver_ParseGetNondrivenBundle(pAVar12,Counter);
      iVar4 = iVar4 + 1;
    } while (pBundle0 == (Ver_Bundle_t *)0x0);
    iVar4 = Ver_ParseDriveFormal(pMan,pAVar12,pBundle0);
    if (iVar4 == 0) break;
LAB_002ada9e:
    iVar4 = Ver_ParseCheckNondrivenNets(pVVar7);
    if ((iVar4 == 0) || (iVar5 <= Counter)) {
      iVar5 = Ver_ParseDriveInputs(pMan,pVVar7);
      if (iVar5 != 0) {
        for (iVar5 = 0; iVar2 != iVar5; iVar5 = iVar5 + 1) {
          pvVar10 = Vec_PtrEntry(pVVar7,iVar5);
          Vec_PtrFree(*(Vec_Ptr_t **)((long)pvVar10 + 0x158));
          *(undefined8 *)((long)pvVar10 + 0x158) = 0;
        }
        Vec_PtrFree(pVVar7);
LAB_002adb45:
        iVar2 = 0;
        while( true ) {
          pVVar7 = pMan->pDesign->vModules;
          if (pVVar7->nSize <= iVar2) goto LAB_002ad9ff;
          pAVar12 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar7,iVar2);
          Abc_NtkFinalizeRead(pAVar12);
          if ((pMan->fCheck != 0) && (iVar5 = Abc_NtkCheckRead(pAVar12), iVar5 == 0)) break;
          iVar2 = iVar2 + 1;
        }
        pMan->fTopLevel = 1;
        sprintf(pMan->sError,"The network check has failed for network %s.",pAVar12->pName);
LAB_002ad9f7:
        Ver_ParsePrintErrorMessage(pMan);
      }
      break;
    }
  }
LAB_002ad9ff:
  pAVar9 = pMan->pDesign;
  pMan->pDesign = (Abc_Des_t *)0x0;
  if (pMan->pProgress != (ProgressBar *)0x0) {
    Extra_ProgressBarStop(pMan->pProgress);
  }
  Ver_StreamFree(pMan->pReader);
  Vec_PtrFree(pMan->vNames);
  Vec_PtrFree(pMan->vStackFn);
  Vec_IntFree(pMan->vStackOp);
  Vec_IntFree(pMan->vPerm);
  free(pMan);
  return pAVar9;
}

Assistant:

Abc_Des_t * Ver_ParseFile( char * pFileName, Abc_Des_t * pGateLib, int fCheck, int fUseMemMan )
{
    Ver_Man_t * p;
    Abc_Des_t * pDesign;
    // start the parser
    p = Ver_ParseStart( pFileName, pGateLib );
    p->fMapped    = glo_fMapped;
    p->fCheck     = fCheck;
    p->fUseMemMan = fUseMemMan;
    if ( glo_fMapped )
    {
        Hop_ManStop((Hop_Man_t *)p->pDesign->pManFunc);
        p->pDesign->pManFunc = NULL;
    }
    // parse the file
    Ver_ParseInternal( p );
    // save the result
    pDesign = p->pDesign;
    p->pDesign = NULL;
    // stop the parser
    Ver_ParseStop( p );
    return pDesign;
}